

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

int sendMessage(string *cmd,int socket_fd,string *currUser)

{
  ostream *poVar1;
  ssize_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_68,currUser,": ");
  std::operator+(&local_48,&local_68,cmd);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_48);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator+(&local_68,currUser,": ");
  std::operator+(&local_48,&local_68,cmd);
  sVar2 = send(socket_fd,local_48._M_dataplus._M_p,0xff,0);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  if (sVar2 == -1) {
    perror("send");
  }
  return 1;
}

Assistant:

int sendMessage(string cmd, int socket_fd, const string& currUser){

    cout << currUser + ": " + cmd << endl;
    if(send(socket_fd,(currUser + ": " + cmd).c_str(), MAXDATASIZE -1, 0) == -1)
        perror("send");

    return 1;
}